

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

int push_function(Context_conflict *ctx,char *sym,MOJOSHADER_astDataType *dt,int just_declare)

{
  void *pvVar1;
  int iVar2;
  void *value;
  void *iter;
  void *local_40;
  void *local_38;
  
  if (ctx->is_func_scope != 0) {
    __assert_fail("!ctx->is_func_scope",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1ad,
                  "int push_function(Context *, const char *, const MOJOSHADER_astDataType *, const int)"
                 );
  }
  if (dt->type == MOJOSHADER_AST_DATATYPE_FUNCTION) {
    local_40 = (void *)0x0;
    local_38 = (void *)0x0;
    do {
      iVar2 = hash_iter((ctx->variables).hash,sym,&local_40,&local_38);
      pvVar1 = local_40;
      if (iVar2 == 0) {
        if (sym == (char *)0x0) {
          iVar2 = 0;
        }
        else if ((dt->function).intrinsic == 0) {
          iVar2 = ctx->user_func_index + 1;
          ctx->user_func_index = iVar2;
        }
        else {
          iVar2 = ctx->intrinsic_func_index + -1;
          ctx->intrinsic_func_index = iVar2;
        }
        push_symbol(ctx,&ctx->variables,sym,dt,iVar2,0);
        return iVar2;
      }
      iVar2 = datatypes_match(dt,*(MOJOSHADER_astDataType **)((long)local_40 + 8));
    } while (iVar2 == 0);
    if (just_declare == 0) {
      failf(ctx,"Function \'%s\' already defined.",sym);
    }
    return *(int *)((long)pvVar1 + 0x10);
  }
  __assert_fail("dt->type == MOJOSHADER_AST_DATATYPE_FUNCTION",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1ae,
                "int push_function(Context *, const char *, const MOJOSHADER_astDataType *, const int)"
               );
}

Assistant:

static int push_function(Context *ctx, const char *sym,
                          const MOJOSHADER_astDataType *dt,
                          const int just_declare)
{
    // we don't have any reason to support nested functions at the moment,
    //  so this would be a bug.
    assert(!ctx->is_func_scope);
    assert(dt->type == MOJOSHADER_AST_DATATYPE_FUNCTION);

    // Functions are always global, so no need to search scopes.
    //  Functions overload, though, so we have to continue iterating to
    //  see if it matches anything.
    const void *value = NULL;
    void *iter = NULL;
    while (hash_iter(ctx->variables.hash, sym, &value, &iter))
    {
        // !!! FIXME: this breaks if you predeclare a function.
        // !!! FIXME:  (a declare AFTER defining works, though.)
        // there's already something called this.
        SymbolScope *item = (SymbolScope *) value;
        if (datatypes_match(dt, item->datatype))
        {
            if (!just_declare)
                failf(ctx, "Function '%s' already defined.", sym);
            return item->index;
        } // if
    } // while

    int idx = 0;
    if ((sym != NULL) && (dt != NULL))
    {
        if (!dt->function.intrinsic)
            idx = ++ctx->user_func_index;  // these are positive.
        else
            idx = --ctx->intrinsic_func_index;  // these are negative.
    } // if

    // push_symbol() doesn't check dupes, because we just did.
    push_symbol(ctx, &ctx->variables, sym, dt, idx, 0);

    return idx;
}